

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O2

char * __thiscall
tinyxml2::StrPair::ParseText(StrPair *this,char *p,char *endTag,int strFlags,int *curLineNumPtr)

{
  char cVar1;
  char cVar2;
  int iVar3;
  size_t __n;
  char *__s1;
  
  cVar1 = *endTag;
  __n = strlen(endTag);
  __s1 = p;
  while( true ) {
    cVar2 = *__s1;
    if (cVar2 == '\0') {
      return (char *)0x0;
    }
    if ((cVar2 == cVar1) && (iVar3 = strncmp(__s1,endTag,__n), iVar3 == 0)) break;
    if (cVar2 == '\n') {
      *curLineNumPtr = *curLineNumPtr + 1;
    }
    __s1 = __s1 + 1;
  }
  Set(this,p,__s1,strFlags);
  return __s1 + __n;
}

Assistant:

char* StrPair::ParseText(char* p, const char* endTag, int strFlags, int* curLineNumPtr)
{
    TIXMLASSERT(p);
    TIXMLASSERT(endTag && *endTag);
    TIXMLASSERT(curLineNumPtr);

    char* start = p;
    const char endChar = *endTag;
    size_t length = strlen(endTag);

    // Inner loop of text parsing.
    while (*p) {
        if (*p == endChar && strncmp(p, endTag, length) == 0) {
            Set(start, p, strFlags);
            return p + length;
        } else if (*p == '\n') {
            ++(*curLineNumPtr);
        }
        ++p;
        TIXMLASSERT(p);
    }
    return 0;
}